

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void renameParentFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  byte bVar1;
  byte *pbVar2;
  char *pcVar3;
  int iVar4;
  uchar *z;
  byte *pbVar5;
  byte *pbVar6;
  ulong uVar7;
  char *pcVar8;
  sqlite3 *db;
  size_t __n;
  uchar *puVar9;
  int token;
  int local_74;
  char *local_70;
  sqlite3 *local_68;
  uchar *local_60;
  sqlite3_context *local_58;
  void *local_50;
  byte *local_48;
  char *local_40;
  byte *local_38;
  
  db = (context->s).db;
  local_58 = context;
  z = (uchar *)sqlite3ValueText(*argv,'\x01');
  pbVar5 = (byte *)sqlite3ValueText(argv[1],'\x01');
  local_50 = sqlite3ValueText(argv[2],'\x01');
  local_60 = z;
  if (*z == '\0') {
    local_70 = (char *)0x0;
  }
  else {
    local_48 = pbVar5 + 1;
    local_70 = (char *)0x0;
    local_68 = db;
    local_38 = pbVar5;
    do {
      iVar4 = sqlite3GetToken(z,&local_74);
      if (local_74 == 0x66) {
        do {
          puVar9 = z;
          z = puVar9 + iVar4;
          iVar4 = sqlite3GetToken(z,&local_74);
          db = local_68;
        } while (local_74 == 0x95);
        if ((puVar9 == (uchar *)0x0) ||
           (pbVar5 = (byte *)sqlite3DbMallocRaw(local_68,iVar4 + 1), pbVar5 == (byte *)0x0)) break;
        __n = (size_t)iVar4;
        memcpy(pbVar5,z,__n);
        pbVar5[__n] = 0;
        sqlite3Dequote((char *)pbVar5);
        pcVar3 = local_70;
        bVar1 = *local_38;
        pbVar6 = pbVar5;
        pbVar2 = local_48;
        while (bVar1 != 0) {
          uVar7 = (ulong)bVar1;
          if (""[uVar7] != ""[*pbVar6]) goto LAB_001a45e5;
          pbVar6 = pbVar6 + 1;
          bVar1 = *pbVar2;
          pbVar2 = pbVar2 + 1;
        }
        uVar7 = 0;
LAB_001a45e5:
        if (""[uVar7] == ""[*pbVar6]) {
          pcVar8 = local_70;
          if (local_70 == (char *)0x0) {
            pcVar8 = "";
          }
          local_40 = sqlite3MPrintf(db,"%s%.*s\"%w\"",pcVar8,(long)z - (long)local_60,local_60,
                                    local_50);
          sqlite3DbFree(local_68,pcVar3);
          local_60 = z + __n;
          local_70 = local_40;
          db = local_68;
        }
        sqlite3DbFree(db,pbVar5);
      }
      else {
        __n = (size_t)iVar4;
      }
      puVar9 = z + __n;
      z = z + __n;
    } while (*puVar9 != '\0');
  }
  pcVar3 = local_70;
  pcVar8 = "";
  if (local_70 != (char *)0x0) {
    pcVar8 = local_70;
  }
  pcVar8 = sqlite3MPrintf(db,"%s%s",pcVar8,local_60);
  setResultStrOrError(local_58,pcVar8,-1,'\x01',sqlite3MallocSize);
  sqlite3DbFree(db,pcVar3);
  return;
}

Assistant:

static void renameParentFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  char *zOutput = 0;
  char *zResult;
  unsigned char const *zInput = sqlite3_value_text(argv[0]);
  unsigned char const *zOld = sqlite3_value_text(argv[1]);
  unsigned char const *zNew = sqlite3_value_text(argv[2]);

  unsigned const char *z;         /* Pointer to token */
  int n;                          /* Length of token z */
  int token;                      /* Type of token */

  UNUSED_PARAMETER(NotUsed);
  for(z=zInput; *z; z=z+n){
    n = sqlite3GetToken(z, &token);
    if( token==TK_REFERENCES ){
      char *zParent;
      do {
        z += n;
        n = sqlite3GetToken(z, &token);
      }while( token==TK_SPACE );

      zParent = sqlite3DbStrNDup(db, (const char *)z, n);
      if( zParent==0 ) break;
      sqlite3Dequote(zParent);
      if( 0==sqlite3StrICmp((const char *)zOld, zParent) ){
        char *zOut = sqlite3MPrintf(db, "%s%.*s\"%w\"", 
            (zOutput?zOutput:""), z-zInput, zInput, (const char *)zNew
        );
        sqlite3DbFree(db, zOutput);
        zOutput = zOut;
        zInput = &z[n];
      }
      sqlite3DbFree(db, zParent);
    }
  }

  zResult = sqlite3MPrintf(db, "%s%s", (zOutput?zOutput:""), zInput), 
  sqlite3_result_text(context, zResult, -1, SQLITE_DYNAMIC);
  sqlite3DbFree(db, zOutput);
}